

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

bool_t EBML_MasterCheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  bool_t bVar1;
  ebml_master *local_30;
  ebml_element *Child;
  int ForProfile_local;
  bool_t bWithDefault_local;
  ebml_master *Element_local;
  
  bVar1 = CheckMandatory(Element,bWithDefault,ForProfile);
  if (bVar1 == 0) {
    Element_local = (ebml_master *)0x0;
  }
  else {
    for (local_30 = (ebml_master *)(Element->Base).Base.Children; local_30 != (ebml_master *)0x0;
        local_30 = (ebml_master *)(local_30->Base).Base.Next) {
      bVar1 = Node_IsPartOf(local_30,0x544d4245);
      if ((bVar1 != 0) &&
         (bVar1 = EBML_MasterCheckMandatory(local_30,bWithDefault,ForProfile), bVar1 == 0)) {
        return 0;
      }
      if (local_30 == (ebml_master *)(local_30->Base).Base.Next) {
        __assert_fail("(nodetree*)(Child) != ((nodetree*)(Child))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                      ,0xbe,"bool_t EBML_MasterCheckMandatory(const ebml_master *, bool_t, int)");
      }
    }
    Element_local = (ebml_master *)0x1;
  }
  return (bool_t)Element_local;
}

Assistant:

bool_t EBML_MasterCheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
	ebml_element *Child;
	if (!CheckMandatory(Element, bWithDefault, ForProfile))
		return 0;

	for (Child = EBML_MasterChildren(Element); Child; Child = EBML_MasterNext(Child))
	{
		if (Node_IsPartOf(Child,EBML_MASTER_CLASS) && !EBML_MasterCheckMandatory((ebml_master*)Child, bWithDefault, ForProfile))
			return 0;
	}
    return 1;
}